

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdatastream.h
# Opt level: O2

bool QDataStream::writeQSizeType(QDataStream *s,qint64 value)

{
  QDataStream *this;
  int iVar1;
  
  if (value < 0xfffffffe) {
    iVar1 = (int)value;
  }
  else {
    if (0x15 < *(int *)(s + 0x18)) {
      this = (QDataStream *)QDataStream::operator<<(s,-2);
      QDataStream::operator<<(this,value);
      return true;
    }
    if (value != 0xfffffffe) {
      QDataStream::setStatus((Status)s);
      return false;
    }
    iVar1 = -2;
  }
  QDataStream::operator<<(s,iVar1);
  return true;
}

Assistant:

bool QDataStream::writeQSizeType(QDataStream &s, qint64 value)
{
    if (value < qint64(ExtendedSize)) {
        s << quint32(value);
    } else if (s.version() >= QDataStream::Qt_6_7) {
        s << ExtendedSize << value;
    } else if (value == qint64(ExtendedSize)) {
        s << ExtendedSize;
    } else {
        s.setStatus(QDataStream::SizeLimitExceeded); // value is too big for old format
        return false;
    }
    return true;
}